

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

RDL_cycleIterator * RDL_cycleIteratorNext(RDL_cycleIterator *it)

{
  RDL_URFinfo *pRVar1;
  RDL_cfam *cfam_00;
  RDL_graph *gra_00;
  RDL_sPathInfo *spi_00;
  int iVar2;
  RDL_pathIterator *pRVar3;
  uint local_3c;
  uint number;
  RDL_sPathInfo *spi;
  RDL_graph *gra;
  RDL_cfam *cfam;
  RDL_URFinfo *uInfo;
  RDL_cycleIterator *it_local;
  
  if (it == (RDL_cycleIterator *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
    it_local = (RDL_cycleIterator *)0x0;
  }
  else {
    iVar2 = RDL_cycleIteratorAtEnd(it);
    if (iVar2 == 0) {
      pRVar1 = it->data->urfInfoPerBCC[it->bcc_index];
      cfam_00 = pRVar1->URFs[it->urf_index][it->rcf_index];
      gra_00 = it->data->bccGraphs->bcc_graphs[it->bcc_index];
      spi_00 = it->data->spiPerBCC[it->bcc_index];
      if (it->it2 == (RDL_pathIterator *)0x0) {
        pRVar3 = RDL_listPaths(cfam_00->r,cfam_00->q,it->mode,gra_00,spi_00);
        it->it2 = pRVar3;
      }
      else {
        RDL_pathIteratorNext(it->it2);
      }
      if (it->it1 == (RDL_pathIterator *)0x0) {
        pRVar3 = RDL_listPaths(cfam_00->r,cfam_00->p,it->mode,gra_00,spi_00);
        it->it1 = pRVar3;
      }
      if ((it->it2->end != '\0') && (it->it1->end == '\0')) {
        RDL_pathIteratorNext(it->it1);
        RDL_deletePathIterator(it->it2);
        pRVar3 = RDL_listPaths(cfam_00->r,cfam_00->q,it->mode,gra_00,spi_00);
        it->it2 = pRVar3;
      }
      it_local = it;
      if ((it->it1->end == '\0') && (it->it2->end == '\0')) {
        RDL_combinePathsToCycle(it->compressed_cycle,it->it1,it->it2,cfam_00);
      }
      else if (it->rcf_index == it->rcf_index_max) {
        if (it->urf_index == it->urf_index_max) {
          if (it->bcc_index == it->bcc_index_max) {
            it->end = '\x01';
          }
          else {
            it->bcc_index = it->bcc_index + 1;
            it->urf_index = 0;
            it->urf_index_max = it->data->nofURFsPerBCC[it->bcc_index] - 1;
            it->rcf_index = 0;
            it->rcf_index_max =
                 it->data->urfInfoPerBCC[it->bcc_index]->nofCFsPerURF[it->urf_index] - 1;
            if (it->mode == 'a') {
              local_3c = it->data->bccGraphs->bcc_graphs[it->bcc_index]->V;
            }
            else {
              local_3c = it->data->bccGraphs->bcc_graphs[it->bcc_index]->E;
            }
            free(it->compressed_cycle);
            RDL_bitset_init(&it->compressed_cycle,local_3c);
            RDL_deletePathIterator(it->it1);
            it->it1 = (RDL_pathIterator *)0x0;
            RDL_deletePathIterator(it->it2);
            it->it2 = (RDL_pathIterator *)0x0;
            RDL_cycleIteratorNext(it);
          }
        }
        else {
          it->urf_index = it->urf_index + 1;
          it->rcf_index = 0;
          it->rcf_index_max = pRVar1->nofCFsPerURF[it->urf_index] - 1;
          RDL_deletePathIterator(it->it1);
          it->it1 = (RDL_pathIterator *)0x0;
          RDL_deletePathIterator(it->it2);
          it->it2 = (RDL_pathIterator *)0x0;
          RDL_cycleIteratorNext(it);
        }
      }
      else {
        it->rcf_index = it->rcf_index + 1;
        it->running_rcf = it->running_rcf + 1;
        RDL_deletePathIterator(it->it1);
        it->it1 = (RDL_pathIterator *)0x0;
        RDL_deletePathIterator(it->it2);
        it->it2 = (RDL_pathIterator *)0x0;
        RDL_cycleIteratorNext(it);
      }
    }
    else {
      (*RDL_outputFunc)(RDL_ERROR,"Cannot advance iterator at end!\n");
      it_local = (RDL_cycleIterator *)0x0;
    }
  }
  return it_local;
}

Assistant:

RDL_cycleIterator* RDL_cycleIteratorNext(RDL_cycleIterator* it)
{
  const RDL_URFinfo *uInfo;
  const RDL_cfam *cfam;
  const RDL_graph *gra;
  const RDL_sPathInfo *spi;
  unsigned number;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot advance iterator at end!\n");
    return NULL;
  }

  uInfo = it->data->urfInfoPerBCC[it->bcc_index];
  cfam = uInfo->URFs[it->urf_index][it->rcf_index];
  gra = it->data->bccGraphs->bcc_graphs[it->bcc_index];
  spi = it->data->spiPerBCC[it->bcc_index];

  /* first call */
  if (it->it2 == NULL) {
    it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
  }
  else {
    /* advance second iterator */
    RDL_pathIteratorNext(it->it2);
  }

  if (it->it1 == NULL) {
    it->it1 = RDL_listPaths(cfam->r, cfam->p, it->mode, gra, spi);
  }

  /* if second iterator is at end, increment first */
  if (it->it2->end) {
    /* do not increment first, if not possible! */
    if (!it->it1->end) {
      /* advance first iterator */
      RDL_pathIteratorNext(it->it1);

      /* re initialize second iterator */
      RDL_deletePathIterator(it->it2);
      it->it2 = RDL_listPaths(cfam->r, cfam->q, it->mode, gra, spi);
    }
  }

  /* if any of the iterators is STILL at the end, we have to change families */
  if (it->it1->end || it->it2->end) {
    /* if RCFs are at end */
    if (it->rcf_index == it->rcf_index_max) {
      if (it->urf_index == it->urf_index_max) {
        if (it->bcc_index == it->bcc_index_max) {
          it->end = 1;
        }
        else {
          ++it->bcc_index;
          it->urf_index = 0;
          it->urf_index_max = it->data->nofURFsPerBCC[it->bcc_index] - 1;
          it->rcf_index = 0;
          it->rcf_index_max = it->data->urfInfoPerBCC[it->bcc_index]->nofCFsPerURF[it->urf_index] - 1;
          if (it->mode == 'a') {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->V;
          }
          else {
            number = it->data->bccGraphs->bcc_graphs[it->bcc_index]->E;
          }
          free(it->compressed_cycle);
          RDL_bitset_init(&it->compressed_cycle, number);
          /* reset all iterators */
          RDL_deletePathIterator(it->it1);
          it->it1 = NULL;
          RDL_deletePathIterator(it->it2);
          it->it2 = NULL;
          /* now try again with new RCF */
          RDL_cycleIteratorNext(it);
        }
      }
      else {
        ++it->urf_index;
        it->rcf_index = 0;
        it->rcf_index_max = uInfo->nofCFsPerURF[it->urf_index] - 1;
        /* reset all iterators */
        RDL_deletePathIterator(it->it1);
        it->it1 = NULL;
        RDL_deletePathIterator(it->it2);
        it->it2 = NULL;
        /* now try again with new RCF */
        RDL_cycleIteratorNext(it);
      }
    }
    else {
      ++it->rcf_index;
      ++it->running_rcf;
      /* reset all iterators */
      RDL_deletePathIterator(it->it1);
      it->it1 = NULL;
      RDL_deletePathIterator(it->it2);
      it->it2 = NULL;
      /* now try again with new RCF */
      RDL_cycleIteratorNext(it);
    }
  }
  else {
    /* otherwise, a new cycle is born ... */
    RDL_combinePathsToCycle(it->compressed_cycle, it->it1, it->it2, cfam);
  }

  return it;
}